

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeFabricVertexGetSubVerticesExp
          (ze_fabric_vertex_handle_t hVertex,uint32_t *pCount,
          ze_fabric_vertex_handle_t *phSubvertices)

{
  ze_fabric_vertex_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  ze_pfnFabricVertexGetSubVerticesExp_t pfnGetSubVerticesExp;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phSubvertices_local;
  uint32_t *pCount_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  pfnGetSubVerticesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c760 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phSubvertices != (ze_fabric_vertex_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (ze_fabric_vertex_handle_t)context_t::get((context_t *)&context);
      phSubvertices[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGetSubVerticesExp._4_4_ = (*DAT_0011c760)(hVertex,pCount,phSubvertices);
  }
  return pfnGetSubVerticesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetSubVerticesExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-vertices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-vertices available.
                                                        ///< if count is greater than the number of sub-vertices available, then
                                                        ///< the driver shall update the value with the correct number of
                                                        ///< sub-vertices available.
        ze_fabric_vertex_handle_t* phSubvertices        ///< [in,out][optional][range(0, *pCount)] array of handle of sub-vertices.
                                                        ///< if count is less than the number of sub-vertices available, then
                                                        ///< driver shall only retrieve that number of sub-vertices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetSubVerticesExp = context.zeDdiTable.FabricVertexExp.pfnGetSubVerticesExp;
        if( nullptr != pfnGetSubVerticesExp )
        {
            result = pfnGetSubVerticesExp( hVertex, pCount, phSubvertices );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phSubvertices ) && ( i < *pCount ); ++i )
                phSubvertices[ i ] = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

        }

        return result;
    }